

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O1

void pipe2_pinger_new(int vectored_writes)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  pinger_t *pinger;
  int64_t eval_b;
  int64_t eval_a;
  uv_os_fd_t fds [2];
  undefined4 local_28;
  undefined4 local_24;
  
  iVar1 = uv_pipe(&local_28,0x40,0x40);
  if (iVar1 == 0) {
    iVar1 = uv_guess_handle(local_28);
    if (iVar1 != 7) goto LAB_001af88b;
    iVar1 = uv_guess_handle(local_24);
    if (iVar1 != 7) goto LAB_001af898;
    puVar2 = (undefined8 *)malloc(0xe8);
    if (puVar2 == (undefined8 *)0x0) goto LAB_001af8a5;
    uVar3 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar3,puVar2,0);
    if (iVar1 != 0) goto LAB_001af8aa;
    iVar1 = uv_pipe_open(puVar2,local_28);
    if (iVar1 != 0) goto LAB_001af8b7;
    pinger = (pinger_t *)malloc(0x168);
    if (pinger == (pinger_t *)0x0) goto LAB_001af8c4;
    pinger->vectored_writes = vectored_writes;
    pinger->pongs = 0;
    pinger->state = 0;
    pinger->pong = PING;
    uVar3 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar3,&pinger->stream,0);
    if (iVar1 != 0) goto LAB_001af8c9;
    iVar1 = uv_pipe_open(&pinger->stream,local_24);
    if (iVar1 == 0) {
      (pinger->stream).tcp.data = pinger;
      *puVar2 = pinger;
      pinger_write_ping(pinger);
      iVar1 = uv_read_start(puVar2,alloc_cb,pinger_read_cb);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001af8e3;
    }
  }
  else {
    pipe2_pinger_new_cold_1();
LAB_001af88b:
    pipe2_pinger_new_cold_2();
LAB_001af898:
    pipe2_pinger_new_cold_3();
LAB_001af8a5:
    pipe2_pinger_new_cold_10();
LAB_001af8aa:
    pipe2_pinger_new_cold_4();
LAB_001af8b7:
    pipe2_pinger_new_cold_5();
LAB_001af8c4:
    pipe2_pinger_new_cold_9();
LAB_001af8c9:
    pipe2_pinger_new_cold_6();
  }
  pipe2_pinger_new_cold_7();
LAB_001af8e3:
  pipe2_pinger_new_cold_8();
  pipe_pinger_new(1);
  run_ping_pong_test();
  completed_pingers = 0;
  pipe2_pinger_new(1);
  run_ping_pong_test();
  return;
}

Assistant:

static void pipe2_pinger_new(int vectored_writes) {
  uv_os_fd_t fds[2];
  pinger_t* pinger;
  uv_pipe_t* ponger;

  /* Try to make a pipe and do NUM_PINGS pings. */
  ASSERT_OK(uv_pipe(fds, UV_NONBLOCK_PIPE, UV_NONBLOCK_PIPE));
  ASSERT_EQ(uv_guess_handle(fds[0]), UV_NAMED_PIPE);
  ASSERT_EQ(uv_guess_handle(fds[1]), UV_NAMED_PIPE);

  ponger = malloc(sizeof(*ponger));
  ASSERT_NOT_NULL(ponger);
  ASSERT_OK(uv_pipe_init(uv_default_loop(), ponger, 0));
  ASSERT_OK(uv_pipe_open(ponger, fds[0]));

  pinger = malloc(sizeof(*pinger));
  ASSERT_NOT_NULL(pinger);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;
  pinger->pong = PING;
  ASSERT_OK(uv_pipe_init(uv_default_loop(), &pinger->stream.pipe, 0));
  ASSERT_OK(uv_pipe_open(&pinger->stream.pipe, fds[1]));
  pinger->stream.pipe.data = pinger; /* record for close_cb */
  ponger->data = pinger; /* record for read_cb */

  pinger_write_ping(pinger);

  ASSERT_OK(uv_read_start((uv_stream_t*) ponger, alloc_cb, pinger_read_cb));
}